

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

SendInternalResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendInternal
          (SendInternalResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPVar1;
  ArrayPtr<unsigned_int> exports;
  undefined7 in_register_00000011;
  anon_class_8_1_8991fb9c *func;
  SetupSendResult result;
  NullableValue<kj::Exception> _exception2597;
  SetupSendResult local_388;
  RpcRequest *local_358;
  NullableValue<kj::Exception> local_350;
  NullableValue<kj::Exception> local_1b8;
  
  setupSend(&local_388,this,isTailCall);
  *(QuestionId *)(this->callBuilder)._builder.data = local_388.questionId;
  if ((int)CONCAT71(in_register_00000011,isTailCall) != 0) {
    *(undefined2 *)((long)(this->callBuilder)._builder.data + 6) = 1;
  }
  local_358 = this;
  kj::
  runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendInternal(bool)::_lambda()_1_>
            ((Maybe<kj::Exception> *)&local_1b8,(kj *)&local_358,func);
  kj::_::NullableValue<kj::Exception>::NullableValue(&local_350,&local_1b8);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1b8);
  if (local_350.isSet == true) {
    (local_388.question)->isAwaitingReturn = false;
    (local_388.question)->skipFinish = true;
    exports.ptr = ((local_388.question)->paramExports).ptr;
    exports.size_ = ((local_388.question)->paramExports).size_;
    releaseExports((this->connectionState).ptr,exports);
    pPVar1 = ((local_388.super_SendInternalResult.questionRef.ptr)->fulfiller).ptr.ptr;
    if (pPVar1 != (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                   *)0x0) {
      (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,&local_350.field_1);
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_350);
  (__return_storage_ptr__->questionRef).disposer =
       local_388.super_SendInternalResult.questionRef.disposer;
  (__return_storage_ptr__->questionRef).ptr = local_388.super_SendInternalResult.questionRef.ptr;
  local_388.super_SendInternalResult.questionRef.ptr = (QuestionRef *)0x0;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
       (PromiseNode *)local_388.super_SendInternalResult.promise.super_PromiseBase.node.ptr;
  local_388.super_SendInternalResult.promise.super_PromiseBase.node.ptr =
       (PromiseBase)(OwnPromiseNode)0x0;
  SendInternalResult::~SendInternalResult(&local_388.super_SendInternalResult);
  return __return_storage_ptr__;
}

Assistant:

SendInternalResult sendInternal(bool isTailCall) {
      auto result = setupSend(isTailCall);

      // Finish and send.
      callBuilder.setQuestionId(result.questionId);
      if (isTailCall) {
        callBuilder.getSendResultsTo().setYourself();
      }
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        KJ_CONTEXT("sending RPC call",
           callBuilder.getInterfaceId(), callBuilder.getMethodId());
        message->send();
      })) {
        // We can't safely throw the exception from here since we've already modified the question
        // table state. We'll have to reject the promise instead.
        // TODO(bug): Attempts to use the pipeline will end up sending a request referencing a
        //   bogus question ID. Can we rethrow after doing the appropriate cleanup, so the pipeline
        //   is never created? See the approach in sendForPipelineInternal() below.
        result.question.isAwaitingReturn = false;
        result.question.skipFinish = true;
        connectionState->releaseExports(result.question.paramExports);
        result.questionRef->reject(kj::mv(exception));
      }

      // Send and return.
      return kj::mv(result);
    }